

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_bool j2k_read_tile_header
                   (opj_j2k_v2_t *p_j2k,OPJ_UINT32 *p_tile_index,OPJ_UINT32 *p_data_size,
                   OPJ_INT32 *p_tile_x0,OPJ_INT32 *p_tile_y0,OPJ_INT32 *p_tile_x1,
                   OPJ_INT32 *p_tile_y1,OPJ_UINT32 *p_nb_comps,opj_bool *p_go_on,
                   opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  byte bVar1;
  OPJ_UINT32 tileno;
  uint uVar2;
  opj_codestream_index_t *poVar3;
  opj_tcp_v2_t *poVar4;
  opj_tile_index_t *poVar5;
  opj_tcd_tile_v2_t *poVar6;
  opj_dec_memory_marker_handler_t *poVar7;
  OPJ_SIZE_T OVar8;
  opj_bool oVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  OPJ_BYTE *pOVar12;
  OPJ_OFF_T OVar13;
  ulong uVar14;
  uint uVar15;
  OPJ_BYTE **ppOVar16;
  char *fmt;
  opj_dec_memory_marker_handler_t *e;
  opj_dec_memory_marker_handler_t *poVar17;
  bool bVar18;
  OPJ_UINT32 local_70;
  uint local_6c;
  OPJ_UINT32 *local_68;
  OPJ_BYTE **local_60;
  OPJ_UINT32 *local_58;
  OPJ_UINT32 *local_50;
  OPJ_INT32 *local_48;
  OPJ_INT32 *local_40;
  OPJ_INT32 *local_38;
  
  local_70 = 0xff90;
  OVar11 = (p_j2k->m_specific_param).m_decoder.m_state;
  if (OVar11 != 8) {
    if (OVar11 != 0x100) {
      return 0;
    }
    local_70 = 0xffd9;
  }
  bVar18 = (*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0;
  local_58 = p_tile_index;
  local_50 = p_data_size;
  local_48 = p_tile_x0;
  local_40 = p_tile_y0;
  local_38 = p_tile_x1;
  if (local_70 != 0xffd9 && bVar18) {
    local_60 = &(p_j2k->m_specific_param).m_decoder.m_header_data;
    local_68 = &(p_j2k->m_specific_param).m_decoder.m_sot_length;
LAB_00127b2d:
    while (local_70 == 0xff93) {
      bVar1 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
      if ((bVar1 & 4) == 0) {
        uVar15 = p_j2k->m_current_tile_number;
        poVar4 = (p_j2k->m_cp).tcps;
        if ((p_j2k->m_specific_param).m_decoder.m_last_tile_part == 0) {
          OVar11 = *local_68;
        }
        else {
          OVar13 = opj_stream_get_number_byte_left(p_stream);
          OVar11 = (OPJ_UINT32)OVar13;
        }
        *local_68 = OVar11 - 2;
        if (poVar4[uVar15].m_data == (OPJ_BYTE *)0x0) {
          pOVar12 = (OPJ_BYTE *)malloc((ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length);
        }
        else {
          pOVar12 = (OPJ_BYTE *)
                    realloc(poVar4[uVar15].m_data,
                            (ulong)((p_j2k->m_specific_param).m_decoder.m_sot_length +
                                   poVar4[uVar15].m_data_size));
        }
        poVar4[uVar15].m_data = pOVar12;
        if (pOVar12 == (OPJ_BYTE *)0x0) {
          opj_event_msg_v2(p_manager,1,"Cannot decode tile\n");
        }
        else {
          poVar3 = p_j2k->cstr_index;
          if (poVar3 != (opj_codestream_index_t *)0x0) {
            OVar13 = opj_stream_tell(p_stream);
            poVar5 = poVar3->tile_index;
            uVar10 = p_j2k->m_current_tile_number;
            uVar2 = poVar5[uVar10].current_tpsno;
            poVar5[uVar10].tp_index[uVar2].end_header = OVar13 + -2;
            poVar5[uVar10].tp_index[uVar2].end_pos =
                 (ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length + OVar13;
            j2k_add_tlmarker_v2(uVar10,poVar3,0xff93,OVar13 + -2,
                                (p_j2k->m_specific_param).m_decoder.m_sot_length + 2);
          }
          OVar8 = opj_stream_read_data
                            (p_stream,poVar4[uVar15].m_data + poVar4[uVar15].m_data_size,
                             (p_j2k->m_specific_param).m_decoder.m_sot_length,p_manager);
          OVar11 = 0x40;
          if (OVar8 == (p_j2k->m_specific_param).m_decoder.m_sot_length) {
            OVar11 = 8;
          }
          (p_j2k->m_specific_param).m_decoder.m_state = OVar11;
          poVar4[uVar15].m_data_size = poVar4[uVar15].m_data_size + OVar8;
        }
        if (pOVar12 == (OPJ_BYTE *)0x0) {
          return 0;
        }
        if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0) {
          pOVar12 = *local_60;
          goto LAB_00127e21;
        }
      }
      else {
        *(byte *)((long)&p_j2k->m_specific_param + 0x54) = bVar1 & 0xfa;
        (p_j2k->m_specific_param).m_decoder.m_state = 8;
        pOVar12 = (p_j2k->m_specific_param).m_decoder.m_header_data;
LAB_00127e21:
        OVar8 = opj_stream_read_data(p_stream,pOVar12,2,p_manager);
        if (OVar8 != 2) goto LAB_00127fcd;
        opj_read_bytes_LE(*local_60,&local_70,2);
      }
      bVar18 = (*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0;
      if ((!bVar18) || (local_70 == 0xffd9)) goto LAB_00127e6b;
    }
    OVar8 = opj_stream_read_data
                      (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
    if (OVar8 == 2) {
      opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_6c,2);
      uVar15 = (p_j2k->m_specific_param).m_decoder.m_state;
      if ((uVar15 & 0x10) != 0) {
        (p_j2k->m_specific_param).m_decoder.m_sot_length =
             ((p_j2k->m_specific_param).m_decoder.m_sot_length - local_6c) - 2;
      }
      local_6c = local_6c - 2;
      poVar7 = j2k_memory_marker_handler_tab;
      do {
        poVar17 = poVar7;
        OVar11 = poVar17->id;
        if (OVar11 == 0) break;
        poVar7 = poVar17 + 1;
      } while (OVar11 != local_70);
      if ((poVar17->states & uVar15) == 0) {
        fmt = "Marker is not compliant with its position\n";
        goto LAB_00127fe6;
      }
      if ((p_j2k->m_specific_param).m_decoder.m_header_data_size < local_6c) {
        pOVar12 = (OPJ_BYTE *)
                  realloc((p_j2k->m_specific_param).m_decoder.m_header_data,(ulong)local_6c);
        (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar12;
        if (pOVar12 == (OPJ_BYTE *)0x0) {
          return 0;
        }
        (p_j2k->m_specific_param).m_decoder.m_header_data_size = local_6c;
      }
      OVar8 = opj_stream_read_data
                        (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,local_6c,
                         p_manager);
      if (OVar8 == local_6c) {
        oVar9 = (*poVar17->handler)(p_j2k,(p_j2k->m_specific_param).m_decoder.m_header_data,local_6c
                                    ,p_manager);
        if (oVar9 == 0) {
          opj_event_msg_v2(p_manager,1,"Fail to read the current marker segment (%#x)\n",
                           (ulong)local_70);
          return 0;
        }
        tileno = p_j2k->m_current_tile_number;
        poVar3 = p_j2k->cstr_index;
        OVar13 = opj_stream_tell(p_stream);
        j2k_add_tlmarker_v2(tileno,poVar3,OVar11,(ulong)(((int)OVar13 - local_6c) - 4),local_6c + 4)
        ;
        if (OVar11 == 0xff90) {
          OVar13 = opj_stream_tell(p_stream);
          uVar14 = (ulong)(((int)OVar13 - local_6c) - 4);
          if ((p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos < (long)uVar14) {
            (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = uVar14;
          }
        }
        if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 4) == 0) {
          OVar8 = opj_stream_read_data
                            (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager)
          ;
          if (OVar8 == 2) {
            opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_70,2);
            goto LAB_00127b2d;
          }
        }
        else {
          uVar14 = opj_stream_skip(p_stream,(ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length,
                                   p_manager);
          if (uVar14 == (p_j2k->m_specific_param).m_decoder.m_sot_length) {
            local_70 = 0xff93;
            goto LAB_00127b2d;
          }
        }
      }
    }
LAB_00127fcd:
    fmt = "Stream too short\n";
    goto LAB_00127fe6;
  }
LAB_00127e6b:
  if ((local_70 == 0xffd9) && ((p_j2k->m_specific_param).m_decoder.m_state != 0x100)) {
    p_j2k->m_current_tile_number = 0;
    (p_j2k->m_specific_param).m_decoder.m_state = 0x100;
  }
  if (bVar18) {
    uVar15 = p_j2k->m_current_tile_number;
    uVar10 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
    if (uVar15 < uVar10) {
      ppOVar16 = &(p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].m_data;
      do {
        if (*ppOVar16 != (OPJ_BYTE *)0x0) break;
        uVar15 = uVar15 + 1;
        p_j2k->m_current_tile_number = uVar15;
        ppOVar16 = ppOVar16 + 0x2c6;
      } while (uVar10 != uVar15);
    }
    if (uVar15 == uVar10) {
      *p_go_on = 0;
      return 1;
    }
  }
  oVar9 = tcd_init_decode_tile(p_j2k->m_tcd,p_j2k->m_current_tile_number);
  if (oVar9 != 0) {
    opj_event_msg_v2(p_manager,4,"Header of tile %d / %d has been read.\n",
                     (ulong)p_j2k->m_current_tile_number,
                     (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th - 1));
    *local_58 = p_j2k->m_current_tile_number;
    *p_go_on = 1;
    OVar11 = tcd_get_decoded_tile_size(p_j2k->m_tcd);
    *local_50 = OVar11;
    poVar6 = p_j2k->m_tcd->tcd_image->tiles;
    *local_48 = poVar6->x0;
    *local_40 = poVar6->y0;
    *local_38 = poVar6->x1;
    *p_tile_y1 = poVar6->y1;
    *p_nb_comps = poVar6->numcomps;
    *(byte *)&p_j2k->m_specific_param = *(byte *)&p_j2k->m_specific_param | 0x80;
    return 1;
  }
  fmt = "Cannot decode tile, memory error\n";
LAB_00127fe6:
  opj_event_msg_v2(p_manager,1,fmt);
  return 0;
}

Assistant:

opj_bool j2k_read_tile_header(	opj_j2k_v2_t * p_j2k,
					 	 	 	OPJ_UINT32 * p_tile_index,
					 	 	 	OPJ_UINT32 * p_data_size,
					 	 	 	OPJ_INT32 * p_tile_x0, OPJ_INT32 * p_tile_y0,
					 	 	 	OPJ_INT32 * p_tile_x1, OPJ_INT32 * p_tile_y1,
								OPJ_UINT32 * p_nb_comps,
								opj_bool * p_go_on,
								opj_stream_private_t *p_stream,
								opj_event_mgr_t * p_manager )
{
	OPJ_UINT32 l_current_marker = J2K_MS_SOT;
	OPJ_UINT32 l_marker_size;
	const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
	opj_tcp_v2_t * l_tcp = NULL;
	OPJ_UINT32 l_nb_tiles;

	/* preconditions */
	assert(p_stream != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	/* Reach the End Of Codestream ?*/
	if (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_EOC){
		l_current_marker = J2K_MS_EOC;
	}
	/* We need to encounter a SOT marker (a new tile-part header) */
	else if	(p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT){
		return OPJ_FALSE;
	}

	/* Read into the codestream until reach the EOC or ! can_decode ??? FIXME */
	while ( (!p_j2k->m_specific_param.m_decoder.m_can_decode) && (l_current_marker != J2K_MS_EOC) ) {

		/* Try to read until the Start Of Data is detected */
		while (l_current_marker != J2K_MS_SOD) {

			/* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read 2 bytes from the buffer as the marker size */
			opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);

			/* Why this condition? FIXME */
			if (p_j2k->m_specific_param.m_decoder.m_state & J2K_STATE_TPH){
				p_j2k->m_specific_param.m_decoder.m_sot_length -= (l_marker_size + 2);
			}
			l_marker_size -= 2; /* Subtract the size of the marker ID already read */

			/* Get the marker handler from the marker ID */
			l_marker_handler = j2k_get_marker_handler(l_current_marker);

			/* Check if the marker is known and if it is the right place to find it */
			if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
				return OPJ_FALSE;
			}
/* FIXME manage case of unknown marker as in the main header ? */

			/* Check if the marker size is compatible with the header data size */
			if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
				p_j2k->m_specific_param.m_decoder.m_header_data = (OPJ_BYTE*)
					opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size);
				if (p_j2k->m_specific_param.m_decoder.m_header_data == 00) {
					return OPJ_FALSE;
				}
				p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
			}

			/* Try to read the rest of the marker segment from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read the marker segment with the correct marker handler */
			if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Fail to read the current marker segment (%#x)\n", l_current_marker);
				return OPJ_FALSE;
			}

			/* Add the marker to the codestream index*/
			j2k_add_tlmarker_v2(p_j2k->m_current_tile_number,
								p_j2k->cstr_index,
								l_marker_handler->id,
								(OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
								l_marker_size + 4 );

			/* Keep the position of the last SOT marker read */
			if ( l_marker_handler->id == J2K_MS_SOT ) {
				OPJ_UINT32 sot_pos = (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4 ;
				if (sot_pos > p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos)
				{
					p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos = sot_pos;
				}
			}


			if (p_j2k->m_specific_param.m_decoder.m_skip_data) {
				/* Skip the rest of the tile part header*/
				if (opj_stream_skip(p_stream,p_j2k->m_specific_param.m_decoder.m_sot_length,p_manager) != p_j2k->m_specific_param.m_decoder.m_sot_length) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}
				l_current_marker = J2K_MS_SOD; /* Normally we reached a SOD */
			}
			else {
				/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer*/
				if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}
				/* Read 2 bytes from the buffer as the new marker ID */
				opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
			}
		}

		/* If we didn't skip data before, we need to read the SOD marker*/
		if (! p_j2k->m_specific_param.m_decoder.m_skip_data) {
			/* Try to read the SOD marker and skip data ? FIXME */
			if (! j2k_read_sod_v2(p_j2k, p_stream, p_manager)) {
				return OPJ_FALSE;
			}



			if (! p_j2k->m_specific_param.m_decoder.m_can_decode){
				/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
				if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}

				/* Read 2 bytes from buffer as the new marker ID */
				opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
			}
		}
		else {
			/* Indicate we will try to read a new tile-part header*/
			p_j2k->m_specific_param.m_decoder.m_skip_data = 0;
			p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
			p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

			/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read 2 bytes from buffer as the new marker ID */
			opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
		}
	}

	/* Current marker is the EOC marker ?*/
	if (l_current_marker == J2K_MS_EOC) {
		if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_EOC ){
			p_j2k->m_current_tile_number = 0;
			p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_EOC;
		}
	}

	/* FIXME DOC ???*/
	if ( ! p_j2k->m_specific_param.m_decoder.m_can_decode) {
		l_tcp = p_j2k->m_cp.tcps + p_j2k->m_current_tile_number;
		l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;

		while( (p_j2k->m_current_tile_number < l_nb_tiles) && (l_tcp->m_data == 00) ) {
			++p_j2k->m_current_tile_number;
			++l_tcp;
		}

		if (p_j2k->m_current_tile_number == l_nb_tiles) {
			*p_go_on = OPJ_FALSE;
			return OPJ_TRUE;
		}
	}

	/*FIXME ???*/
	if (! tcd_init_decode_tile(p_j2k->m_tcd, p_j2k->m_current_tile_number)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Cannot decode tile, memory error\n");
		return OPJ_FALSE;
	}

	opj_event_msg_v2(p_manager, EVT_INFO, "Header of tile %d / %d has been read.\n",
			p_j2k->m_current_tile_number, (p_j2k->m_cp.th * p_j2k->m_cp.tw) - 1);

	*p_tile_index = p_j2k->m_current_tile_number;
	*p_go_on = OPJ_TRUE;
	*p_data_size = tcd_get_decoded_tile_size(p_j2k->m_tcd);
	*p_tile_x0 = p_j2k->m_tcd->tcd_image->tiles->x0;
	*p_tile_y0 = p_j2k->m_tcd->tcd_image->tiles->y0;
	*p_tile_x1 = p_j2k->m_tcd->tcd_image->tiles->x1;
	*p_tile_y1 = p_j2k->m_tcd->tcd_image->tiles->y1;
	*p_nb_comps = p_j2k->m_tcd->tcd_image->tiles->numcomps;

	 p_j2k->m_specific_param.m_decoder.m_state |= 0x0080;/* FIXME J2K_DEC_STATE_DATA;*/

	return OPJ_TRUE;
}